

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_BOOL ref_phys_wall_distance_bc(REF_INT bc)

{
  if ((((0x23 < bc - 0xfebU) || ((0x802000001U >> ((ulong)(bc - 0xfebU) & 0x3f) & 1) == 0)) &&
      (bc != -0x100e)) && (((bc != -0x1004 && (bc != -4000)) && ((bc != 4000 && (bc != 0x1838))))))
  {
    return (REF_BOOL)(bc == 0x1842);
  }
  return 1;
}

Assistant:

REF_FCN REF_BOOL ref_phys_wall_distance_bc(REF_INT bc) {
  return (bc == 4000 ||  /* viscous_solid */
          bc == -4000 || /* viscous_solid_trs */
          bc == 4075 ||  /* viscous_wall_rough */
          bc == 4100 ||  /* viscous_wall_function */
          bc == 4110 ||  /* viscous_weak_wall */
          bc == -4110 || /* viscous_weak_trs */
          bc == -4100 || /* viscous_wf_trs */
          bc == 6200 ||  /* block_interface */
          bc == 6210);   /* filter */
}